

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void do_circle_stab(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA **ppCVar1;
  int iVar2;
  int iVar3;
  CHAR_DATA *victim_00;
  CHAR_DATA *in_RDI;
  int dam;
  int chance;
  OBJ_DATA *obj;
  CHAR_DATA *v_next;
  CHAR_DATA *v_check;
  CHAR_DATA *victim;
  char arg [4608];
  bool attempt_dual;
  undefined4 in_stack_ffffffffffffed98;
  int in_stack_ffffffffffffed9c;
  char *in_stack_ffffffffffffeda0;
  CHAR_DATA *in_stack_ffffffffffffeda8;
  undefined4 in_stack_ffffffffffffedb0;
  undefined4 in_stack_ffffffffffffedb4;
  int in_stack_ffffffffffffedb8;
  undefined1 show;
  int dam_type;
  int in_stack_ffffffffffffedc0;
  CHAR_DATA *in_stack_ffffffffffffedd0;
  CHAR_DATA *local_1228;
  CHAR_DATA *local_1220;
  char local_1218;
  int in_stack_ffffffffffffee74;
  undefined1 in_stack_ffffffffffffee7b;
  int in_stack_ffffffffffffee7c;
  CHAR_DATA *in_stack_ffffffffffffee80;
  int in_stack_ffffffffffffee9c;
  CHAR_DATA *in_stack_ffffffffffffeea0;
  char *in_stack_ffffffffffffffa0;
  CHAR_DATA *in_stack_ffffffffffffffa8;
  
  one_argument(in_stack_ffffffffffffeda0,
               (char *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98));
  iVar2 = get_skill(in_stack_ffffffffffffeea0,in_stack_ffffffffffffee9c);
  if (iVar2 < 2) {
    send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                 in_stack_ffffffffffffeda8);
  }
  else {
    if (local_1218 == '\0') {
      local_1220 = in_RDI->fighting;
      if (local_1220 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                     in_stack_ffffffffffffeda8);
        return;
      }
    }
    else {
      local_1220 = get_char_room(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
      if (local_1220 == (CHAR_DATA *)0x0) {
        send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                     in_stack_ffffffffffffeda8);
        return;
      }
    }
    if (in_RDI->fighting == (CHAR_DATA *)0x0) {
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                   in_stack_ffffffffffffeda8);
    }
    else {
      local_1228 = in_RDI->in_room->people;
      do {
        if (local_1228 == (CHAR_DATA *)0x0) {
          if (local_1220 == in_RDI) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                         in_stack_ffffffffffffeda8);
            return;
          }
          victim_00 = (CHAR_DATA *)get_eq_char(in_RDI,0x10);
          if ((victim_00 == (CHAR_DATA *)0x0) || (*(int *)((long)&victim_00->description + 4) != 2))
          {
            victim_00 = (CHAR_DATA *)get_eq_char(in_RDI,0x12);
          }
          if (victim_00 == (CHAR_DATA *)0x0) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                         in_stack_ffffffffffffeda8);
            return;
          }
          if (*(int *)((long)&victim_00->description + 4) != 2) {
            send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                         in_stack_ffffffffffffeda8);
            return;
          }
          iVar2 = ((int)in_RDI->level - (int)local_1220->level) + iVar2;
          if (iVar2 < 5) {
            iVar2 = in_stack_ffffffffffffedb8;
            dam_type = 5;
          }
          else {
            dam_type = iVar2;
            if (0x5f < iVar2) {
              iVar2 = 0x5f;
              dam_type = iVar2;
            }
          }
          show = (undefined1)((uint)iVar2 >> 0x18);
          iVar2 = dam_type;
          WAIT_STATE((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                     (int)((ulong)in_stack_ffffffffffffeda8 >> 0x20));
          iVar3 = number_percent();
          if (iVar3 < iVar2) {
            act((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                (void *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),0);
            act((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                (void *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),0);
            act((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                in_stack_ffffffffffffeda8,in_stack_ffffffffffffeda0,
                (void *)CONCAT44(in_stack_ffffffffffffed9c,in_stack_ffffffffffffed98),0);
            iVar3 = (int)in_stack_ffffffffffffeda0;
            check_improve(in_stack_ffffffffffffee80,in_stack_ffffffffffffee7c,
                          (bool)in_stack_ffffffffffffee7b,in_stack_ffffffffffffee74);
            iVar3 = dice(iVar3,in_stack_ffffffffffffed9c);
            iVar3 = iVar3 + 0x28;
            if ((0xf < in_RDI->level) && (0x14 < in_RDI->level)) {
              if (in_RDI->level < 0x19) {
                iVar3 = iVar3 * 2;
              }
              else if (in_RDI->level < 0x1e) {
                iVar3 = iVar3 * 2;
              }
              else if (in_RDI->level < 0x28) {
                iVar3 = iVar3 * 2;
              }
              else {
                iVar3 = iVar3 * 3;
              }
            }
            std::vector<attack_type,_std::allocator<attack_type>_>::operator[]
                      (&attack_table,(long)*(int *)&victim_00->prefix);
            damage_old(in_stack_ffffffffffffedd0,victim_00,iVar2,iVar3,dam_type,(bool)show);
            return;
          }
          check_improve(in_stack_ffffffffffffee80,in_stack_ffffffffffffee7c,
                        (bool)in_stack_ffffffffffffee7b,in_stack_ffffffffffffee74);
          damage_old(in_stack_ffffffffffffedd0,victim_00,iVar2,in_stack_ffffffffffffedc0,dam_type,
                     (bool)show);
          return;
        }
        in_stack_ffffffffffffedd0 = local_1228->next_in_room;
        ppCVar1 = &local_1228->fighting;
        local_1228 = in_stack_ffffffffffffedd0;
      } while (*ppCVar1 != in_RDI);
      send_to_char((char *)CONCAT44(in_stack_ffffffffffffedb4,in_stack_ffffffffffffedb0),
                   in_stack_ffffffffffffeda8);
    }
  }
  return;
}

Assistant:

void do_circle_stab(CHAR_DATA *ch, char *argument)
{
	bool attempt_dual;
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	CHAR_DATA *v_check;
	CHAR_DATA *v_next;
	OBJ_DATA *obj;
	int chance;
	int dam;

	attempt_dual = false;
	one_argument(argument, arg);

	chance = get_skill(ch, gsn_circle);

	if (chance <= 1)
	{
		send_to_char("Circling? What's that?\n\r", ch);
		return;
	}

	if (arg[0] == '\0')
	{
		victim = ch->fighting;

		if (victim == nullptr)
		{
			send_to_char("But you aren't fighting anyone.\n\r", ch);
			return;
		}
	}
	else if ((victim = get_char_room(ch, arg)) == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	if (ch->fighting == nullptr)
	{
		send_to_char("You can't circle someone like that.\n\r", ch);
		return;
	}

	for (v_check = ch->in_room->people; v_check != nullptr; v_check = v_next)
	{
		v_next = v_check->next_in_room;

		if (v_check->fighting == ch)
		{
			send_to_char("Not while you're defending yourself!\n\r", ch);
			return;
		}
	}

	if (victim == ch)
	{
		send_to_char("huh?\n\r", ch);
		return;
	}

	obj = get_eq_char(ch, WEAR_WIELD);

	if (obj == nullptr || obj->value[0] != WEAPON_DAGGER)
	{
		attempt_dual = true;
		obj = get_eq_char(ch, WEAR_DUAL_WIELD);
	}

	if (obj == nullptr)
	{
		send_to_char("You must wield a dagger to circle stab.\n\r", ch);
		return;
	}

	if (obj->value[0] != 2)
	{
		send_to_char("You must wield a dagger to circle stab.\n\r", ch);
		return;
	}

	chance += (ch->level - victim->level);
	chance = URANGE(5, chance, 95);

	WAIT_STATE(ch, skill_table[gsn_circle].beats);

	if (number_percent() < chance)
	{
		act("You circle around $N to land a critical strike.", ch, nullptr, victim, TO_CHAR);
		act("$n circles around you to land a critical strike.", ch, nullptr, victim, TO_VICT);
		act("$n circles $N to land a critical strike.", ch, nullptr, victim, TO_NOTVICT);

		check_improve(ch, gsn_circle, true, 1);

		dam = dice(obj->value[1], obj->value[2]);
		dam += 40;

		if (ch->level <= 15)
			dam *= 1;
		else if (ch->level <= 20)
			dam *= 3 / 2;
		else if (ch->level < 25)
			dam *= 2;
		else if (ch->level < 30)
			dam *= 7 / 3;
		else if (ch->level < 40)
			dam *= 5 / 2;
		else if (ch->level <= 49)
			dam *= 7 / 2;
		else if (ch->level <= 55)
			dam *= 10 / 3;
		else
			dam *= 10 / 3;

		damage_old(ch, victim, dam, gsn_circle, attack_table[obj->value[3]].damage, true);
	}
	else
	{
		check_improve(ch, gsn_circle, false, 1);
		damage_old(ch, victim, 0, gsn_circle, DAM_NONE, true);
	}
}